

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O0

EVP_MD * EVP_get_digestbynid(int nid)

{
  EVP_MD *pEVar1;
  uint local_18;
  uint i;
  int nid_local;
  
  if (nid != 0) {
    for (local_18 = 0; local_18 < 0x12; local_18 = local_18 + 1) {
      if (nid_to_digest_mapping[local_18].nid == nid) {
        pEVar1 = (*nid_to_digest_mapping[local_18].md_func)();
        return pEVar1;
      }
    }
  }
  return (EVP_MD *)0x0;
}

Assistant:

const EVP_MD *EVP_get_digestbynid(int nid) {
  if (nid == NID_undef) {
    // Skip the |NID_undef| entries in |nid_to_digest_mapping|.
    return NULL;
  }

  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(nid_to_digest_mapping); i++) {
    if (nid_to_digest_mapping[i].nid == nid) {
      return nid_to_digest_mapping[i].md_func();
    }
  }

  return NULL;
}